

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

char * escape_string(char *src)

{
  char *dst;
  size_t i;
  size_t bytecount;
  char *src_local;
  
  i = 0;
  for (dst = (char *)0x0; src[(long)dst] != '\0'; dst = dst + 1) {
    if ((src[(long)dst] == '\"') || (src[(long)dst] == '\\')) {
      i = i + 1;
    }
  }
  src_local = (char *)(*Curl_cmalloc)((size_t)(dst + i + 1));
  if (src_local == (char *)0x0) {
    src_local = (char *)0x0;
  }
  else {
    dst = (char *)0x0;
    for (bytecount = (size_t)src; *(char *)bytecount != '\0'; bytecount = bytecount + 1) {
      if ((*(char *)bytecount == '\"') || (*(char *)bytecount == '\\')) {
        src_local[(long)dst] = '\\';
        dst = dst + 1;
      }
      src_local[(long)dst] = *(char *)bytecount;
      dst = dst + 1;
    }
    src_local[(long)dst] = '\0';
  }
  return src_local;
}

Assistant:

static char *escape_string(const char *src)
{
  size_t bytecount = 0;
  size_t i;
  char *dst;

  for(i = 0; src[i]; i++)
    if(src[i] == '"' || src[i] == '\\')
      bytecount++;

  bytecount += i;
  dst = malloc(bytecount + 1);
  if(!dst)
    return NULL;

  for(i = 0; *src; src++) {
    if(*src == '"' || *src == '\\')
      dst[i++] = '\\';
    dst[i++] = *src;
  }

  dst[i] = '\0';
  return dst;
}